

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::IntegrationTest_exposesCountersOnDifferentUrls_Test::
IntegrationTest_exposesCountersOnDifferentUrls_Test
          (IntegrationTest_exposesCountersOnDifferentUrls_Test *this)

{
  IntegrationTest_exposesCountersOnDifferentUrls_Test *this_local;
  
  IntegrationTest::IntegrationTest(&this->super_IntegrationTest);
  (this->super_IntegrationTest).super_Test._vptr_Test =
       (_func_int **)&PTR__IntegrationTest_exposesCountersOnDifferentUrls_Test_00241a88;
  return;
}

Assistant:

TEST_F(IntegrationTest, exposesCountersOnDifferentUrls) {
  const std::string first_metrics_path = "/first";
  const std::string second_metrics_path = "/second";

  const std::string first_counter_name = "first_total";
  const std::string second_counter_name = "second_total";

  const auto first_registry =
      RegisterSomeCounter(first_counter_name, first_metrics_path);
  const auto second_registry =
      RegisterSomeCounter(second_counter_name, second_metrics_path);

  // all set-up

  const auto first_metrics = FetchMetrics(first_metrics_path);
  const auto second_metrics = FetchMetrics(second_metrics_path);

  // check results

  ASSERT_EQ(first_metrics.code, 200);
  ASSERT_EQ(second_metrics.code, 200);

  EXPECT_THAT(first_metrics.body, HasSubstr(first_counter_name));
  EXPECT_THAT(second_metrics.body, HasSubstr(second_counter_name));

  EXPECT_THAT(first_metrics.body, Not(HasSubstr(second_counter_name)));
  EXPECT_THAT(second_metrics.body, Not(HasSubstr(first_counter_name)));
}